

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ParameterDeclarationStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ParameterDeclarationStatementSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ParameterDeclarationBaseSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          ParameterDeclarationBaseSyntax *args_1,Token *args_2)

{
  Token semi;
  ParameterDeclarationStatementSyntax *this_00;
  
  this_00 = (ParameterDeclarationStatementSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ParameterDeclarationStatementSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ParameterDeclarationStatementSyntax *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  semi.kind = args_2->kind;
  semi._2_1_ = args_2->field_0x2;
  semi.numFlags.raw = (args_2->numFlags).raw;
  semi.rawLen = args_2->rawLen;
  semi.info = args_2->info;
  slang::syntax::ParameterDeclarationStatementSyntax::ParameterDeclarationStatementSyntax
            (this_00,args,args_1,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }